

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.cc
# Opt level: O0

void VW::parse_example_label(vw *all,example *ec,string *label)

{
  undefined1 extraout_var;
  v_array<substring> *in_RDX;
  long in_RSI;
  undefined8 *in_RDI;
  substring str;
  char *cstr;
  v_array<substring> words;
  undefined1 allow_empty;
  v_array<substring> *in_stack_ffffffffffffffc8;
  char in_stack_ffffffffffffffd7;
  substring in_stack_ffffffffffffffd8;
  
  v_init<substring>();
  std::__cxx11::string::c_str();
  allow_empty = extraout_var;
  std::__cxx11::string::length();
  tokenize<v_array<substring>>
            (in_stack_ffffffffffffffd7,in_stack_ffffffffffffffd8,in_stack_ffffffffffffffc8,
             (bool)allow_empty);
  (**(code **)(in_RDI[1] + 0x338))(in_RDI[1],*in_RDI,in_RSI + 0x6828,&stack0xffffffffffffffc8);
  v_array<substring>::clear(in_RDX);
  v_array<substring>::delete_v(in_RDX);
  return;
}

Assistant:

void parse_example_label(vw& all, example& ec, string label)
{
  v_array<substring> words = v_init<substring>();
  char* cstr = (char*)label.c_str();
  substring str = {cstr, cstr + label.length()};
  tokenize(' ', str, words);
  all.p->lp.parse_label(all.p, all.sd, &ec.l, words);
  words.clear();
  words.delete_v();
}